

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImVec2_resizeT(ImVector_ImVec2 *self,int new_size,ImVec2 v)

{
  ImVec2 *__dest;
  long lVar1;
  int iVar2;
  
  iVar2 = self->Capacity;
  if (iVar2 < new_size) {
    if (iVar2 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar2 / 2 + iVar2;
    }
    if (iVar2 <= new_size) {
      iVar2 = new_size;
    }
    __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar2 << 3);
    if (self->Data != (ImVec2 *)0x0) {
      memcpy(__dest,self->Data,(long)self->Size << 3);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar2;
  }
  lVar1 = (long)self->Size;
  if (self->Size < new_size) {
    do {
      self->Data[lVar1] = v;
      lVar1 = lVar1 + 1;
    } while (new_size != lVar1);
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImVec2_resizeT(ImVector_ImVec2* self,int new_size,const ImVec2 v)
{
    return self->resize(new_size,v);
}